

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket_adt.c
# Opt level: O1

msocket_adt_error_t msocket_bytearray_reserve(msocket_bytearray_t *self,uint32_t u32NewLen)

{
  msocket_adt_error_t mVar1;
  
  if (self == (msocket_bytearray_t *)0x0) {
    return '\x01';
  }
  if (self->u32AllocLen < u32NewLen) {
    mVar1 = msocket_bytearray_grow(self,u32NewLen);
    if (mVar1 != '\0') {
      return mVar1;
    }
  }
  return '\0';
}

Assistant:

msocket_adt_error_t msocket_bytearray_reserve(msocket_bytearray_t *self, uint32_t u32NewLen){
   if(self){
      if(u32NewLen > self->u32AllocLen){
         msocket_adt_error_t errorCode = msocket_bytearray_grow(self,u32NewLen);
         if(errorCode != ADT_NO_ERROR){
            return errorCode;
         }
      }
      return ADT_NO_ERROR;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}